

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

bool __thiscall ftxui::TabContainer::OnMouseEvent(TabContainer *this,Event *event)

{
  undefined1 uVar1;
  long *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [64];
  
  (*(this->super_ContainerBase).super_ComponentBase._vptr_ComponentBase[4])(&local_60,this);
  Event::Event((Event *)local_50,event);
  uVar1 = (**(code **)(*local_60 + 0x18))(local_60,local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  return (bool)uVar1;
}

Assistant:

bool OnMouseEvent(Event event) override {
    return ActiveChild()->OnEvent(event);
  }